

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O1

void __thiscall
Simulator::simulation
          (Simulator *this,MultipleShootingCGMRES *cgmres_solver,VectorXd *initial_state_vec,
          double start_time,double end_time,double sampling_period,string *savefile_name)

{
  NMPCModel *this_00;
  pointer pcVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  Index size;
  double *pdVar7;
  void *__ptr;
  undefined8 *puVar8;
  void *pvVar9;
  double *pdVar10;
  ostream *poVar11;
  long lVar12;
  ulong uVar13;
  Index outer_stride;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined4 uVar17;
  double dVar18;
  undefined8 in_XMM1_Qb;
  VectorXd current_state_vec;
  VectorXd control_input_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  ofstream conditions_data;
  ofstream error_data;
  ofstream control_input_data;
  ofstream state_data;
  VectorXd local_918;
  double local_900;
  void *local_8f8;
  ulong uStack_8f0;
  string *local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  uint local_8bc;
  undefined1 local_8b8 [16];
  Simulator *local_8a8;
  MultipleShootingCGMRES *local_8a0;
  size_t local_898;
  NumericalIntegrator *local_890;
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  void *local_868;
  ulong uStack_860;
  void *local_848;
  ulong uStack_840;
  undefined1 *local_830;
  filebuf local_828 [8];
  undefined1 local_820 [232];
  ios_base aiStack_738 [264];
  undefined1 *local_630;
  filebuf local_628 [8];
  undefined1 local_620 [232];
  ios_base aiStack_538 [264];
  undefined1 *local_430;
  filebuf local_428 [8];
  undefined1 local_420 [232];
  ios_base aiStack_338 [264];
  undefined1 *local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_8b8._8_8_ = in_XMM1_Qb;
  local_8b8._0_8_ = end_time;
  this_00 = &this->model_;
  local_8e0 = savefile_name;
  local_8d8 = sampling_period;
  local_8d0 = start_time;
  local_8a8 = this;
  local_8a0 = cgmres_solver;
  uVar5 = NMPCModel::dimState(this_00);
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((int)uVar5 < 0) {
LAB_00107bea:
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar14 = (ulong)uVar5;
  pdVar7 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (uVar14 != 0) {
    free((void *)0x0);
    if (uVar5 == 0) {
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      pdVar7 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
    }
    else {
      pdVar7 = (double *)malloc(uVar14 * 8);
      if ((uVar5 != 1) && (((ulong)pdVar7 & 0xf) != 0)) goto LAB_00107b9d;
      if (pdVar7 == (double *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::ios::widen;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar7
  ;
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar14
  ;
  uVar5 = NMPCModel::dimState(this_00);
  if ((int)uVar5 < 0) goto LAB_00107bea;
  uVar14 = (ulong)uVar5;
  if (uVar5 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(uVar14 * 8);
    if ((uVar5 != 1) && (((ulong)__ptr & 0xf) != 0)) goto LAB_00107b9d;
    if (__ptr == (void *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  uVar6 = NMPCModel::dimControlInput(this_00);
  local_8f8 = (void *)0x0;
  uStack_8f0 = 0;
  local_8bc = uVar5;
  if ((int)uVar6 < 0) goto LAB_00107bea;
  uVar13 = (ulong)uVar6;
  pvVar9 = local_8f8;
  if (uVar13 != 0) {
    free((void *)0x0);
    if (uVar6 == 0) {
      local_8f8 = (void *)0x0;
      pvVar9 = local_8f8;
    }
    else {
      pvVar9 = malloc(uVar13 * 8);
      if ((uVar6 != 1) && (((ulong)pvVar9 & 0xf) != 0)) goto LAB_00107b9d;
      if (pvVar9 == (void *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = std::ios::widen;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  local_8f8 = pvVar9;
  pcVar1 = (local_8e0->_M_dataplus)._M_p;
  uStack_8f0 = uVar13;
  local_430 = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar1,pcVar1 + local_8e0->_M_string_length);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::ofstream(&local_230,(string *)&local_430,_S_out);
  if (local_430 != local_420) {
    operator_delete(local_430);
  }
  pcVar1 = (local_8e0->_M_dataplus)._M_p;
  local_630 = local_620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_630,pcVar1,pcVar1 + local_8e0->_M_string_length);
  std::__cxx11::string::append((char *)&local_630);
  std::ofstream::ofstream(&local_430,(string *)&local_630,_S_out);
  if (local_630 != local_620) {
    operator_delete(local_630);
  }
  pcVar1 = (local_8e0->_M_dataplus)._M_p;
  local_830 = local_820;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_830,pcVar1,pcVar1 + local_8e0->_M_string_length);
  std::__cxx11::string::append((char *)&local_830);
  std::ofstream::ofstream(&local_630,(string *)&local_830,_S_out);
  if (local_830 != local_820) {
    operator_delete(local_830);
  }
  pcVar1 = (local_8e0->_M_dataplus)._M_p;
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_888,pcVar1,pcVar1 + local_8e0->_M_string_length);
  std::__cxx11::string::append((char *)local_888);
  std::ofstream::ofstream(&local_830,(string *)local_888,_S_out);
  if (local_888[0] != local_878) {
    operator_delete(local_888[0]);
  }
  pdVar7 = (initial_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_data;
  uVar13 = (initial_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_rows;
  pdVar10 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar4 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar13) {
    if ((long)uVar13 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    free(local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar4 = uVar13;
    if (uVar13 != 0) {
      if (uVar13 >> 0x3d == 0) {
        pdVar10 = (double *)malloc(uVar13 * 8);
        if (uVar13 != 1 && ((ulong)pdVar10 & 0xf) != 0) {
LAB_00107b9d:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar10 != (double *)0x0) goto LAB_001074ed;
      }
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pdVar10 = (double *)0x0;
  }
LAB_001074ed:
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar4;
  local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       pdVar10;
  if (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar13) {
LAB_00107b5f:
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                 );
  }
  uVar13 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           - (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  {
    lVar15 = 0;
    do {
      pdVar10 = pdVar7 + lVar15;
      dVar18 = pdVar10[1];
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar15] = *pdVar10;
      (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
      lVar15)[1] = dVar18;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)uVar13);
  }
  if ((long)uVar13 <
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    do {
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar13] = pdVar7[uVar13];
      uVar13 = uVar13 + 1;
    } while (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows != uVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start simulation",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_900 = 0.0;
  if (local_8d0 < (double)local_8b8._0_8_) {
    local_890 = (NumericalIntegrator *)&local_8a8->field_0x40;
    local_898 = uVar14 * 8;
    local_900 = 0.0;
    dVar18 = local_8d0;
    do {
      local_8c8 = dVar18;
      dVar18 = MultipleShootingCGMRES::getError(local_8a0,dVar18,&local_918);
      saveData(local_8a8,(ofstream *)&local_230,(ofstream *)&local_430,(ofstream *)&local_630,dVar18
               ,&local_918,(VectorXd *)&local_8f8,dVar18);
      local_848 = __ptr;
      uStack_840 = uVar14;
      NumericalIntegrator::rungeKuttaGill
                (local_890,local_8c8,&local_918,(VectorXd *)&local_8f8,local_8d8,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                 &local_848);
      lVar15 = std::chrono::_V2::system_clock::now();
      local_868 = local_8f8;
      uStack_860 = uStack_8f0;
      if ((long)uStack_8f0 < 0 && local_8f8 != (void *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      MultipleShootingCGMRES::controlUpdate
                (local_8a0,local_8c8,local_8d8,&local_918,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                 &local_868);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"control_input_vec : ",0x14);
      poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_8f8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      lVar12 = std::chrono::_V2::system_clock::now();
      pdVar7 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar13 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar14) {
        free(local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar5 = local_8bc;
        uVar13 = uVar14;
        if (local_8bc == 0) {
          pdVar7 = (double *)0x0;
        }
        else {
          pdVar7 = (double *)malloc(local_898);
          if ((uVar5 != 1) && (((ulong)pdVar7 & 0xf) != 0)) goto LAB_00107b9d;
          if (pdVar7 == (double *)0x0) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar8 = std::ios::widen;
            __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
      }
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar13;
      local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar7;
      if (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar14) goto LAB_00107b5f;
      uVar13 = local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows - (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) {
        lVar16 = 0;
        do {
          pdVar7 = (double *)((long)__ptr + lVar16 * 8);
          dVar18 = pdVar7[1];
          local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [lVar16] = *pdVar7;
          (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          + lVar16)[1] = dVar18;
          lVar16 = lVar16 + 2;
        } while (lVar16 < (long)uVar13);
      }
      if ((long)uVar13 <
          local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      {
        do {
          local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar13] = *(double *)((long)__ptr + uVar13 * 8);
          uVar13 = uVar13 + 1;
        } while (local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows != uVar13);
      }
      local_900 = local_900 + (double)((lVar12 - lVar15) / 1000) * 1e-06;
      dVar18 = local_8c8 + local_8d8;
    } while (dVar18 < (double)local_8b8._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End simulation",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total CPU time for control update: ",0x23);
  poVar11 = std::ostream::_M_insert<double>(local_900);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," [sec]",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"simulation name: ",0x11)
  ;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_830,(local_8e0->_M_dataplus)._M_p,
                       local_8e0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"simulation time: ",0x11)
  ;
  uVar17 = local_8b8._12_4_;
  dVar18 = local_8b8._0_8_ - local_8d0;
  local_8b8._8_4_ = local_8b8._8_4_;
  local_8b8._0_8_ = dVar18;
  local_8b8._12_4_ = uVar17;
  poVar11 = std::ostream::_M_insert<double>(dVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_830,"CPU time for control update (total): ",0x25);
  poVar11 = std::ostream::_M_insert<double>(local_900);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"sampling time: ",0xf);
  poVar11 = std::ostream::_M_insert<double>(local_8d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_830,"CPU time for control update (1step): ",0x25);
  poVar11 = std::ostream::_M_insert<double>
                      (local_900 / (double)(int)((double)local_8b8._0_8_ / local_8d8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," [sec]\n",7);
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  uVar3 = __filebuf;
  puVar2 = _VTT;
  local_830 = _VTT;
  *(undefined8 *)(local_828 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_828);
  std::ios_base::~ios_base(aiStack_738);
  local_630 = puVar2;
  *(undefined8 *)(local_628 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_628);
  std::ios_base::~ios_base(aiStack_538);
  local_430 = puVar2;
  *(undefined8 *)(local_428 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = puVar2;
  *(undefined8 *)(local_228 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  free(local_8f8);
  free(__ptr);
  free(local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void Simulator::simulation(MultipleShootingCGMRES cgmres_solver, const Eigen::VectorXd& initial_state_vec, const double start_time, const double end_time, const double sampling_period, const std::string savefile_name)
{
    Eigen::VectorXd current_state_vec(model_.dimState()), next_state_vec(model_.dimState()), control_input_vec(model_.dimControlInput());
    std::chrono::system_clock::time_point start_clock, end_clock;

    std::ofstream state_data(savefile_name + "_state.dat");
    std::ofstream control_input_data(savefile_name + "_control_input.dat");
    std::ofstream error_data(savefile_name + "_error.dat");
    std::ofstream conditions_data(savefile_name + "_conditions.dat");

    double total_time = 0;
    current_state_vec = initial_state_vec;
    std::cout << "Start simulation" << std::endl;
    for(double current_time=start_time; current_time<end_time; current_time+= sampling_period){
        saveData(state_data, control_input_data, error_data, current_time, current_state_vec, control_input_vec, cgmres_solver.getError(current_time, current_state_vec));

        // Compute the next state vector using the 4th Runge-Kutta-Gill method.
        rungeKuttaGill(current_time, current_state_vec, control_input_vec, sampling_period, next_state_vec);

        // Update the solution and measure computational time.
        start_clock = std::chrono::system_clock::now();
        cgmres_solver.controlUpdate(current_time, sampling_period, current_state_vec, control_input_vec);
        std::cout << "control_input_vec : " << control_input_vec << std::endl;

        end_clock = std::chrono::system_clock::now();

        // Convert computational time to seconds.
        double step_time = std::chrono::duration_cast<std::chrono::microseconds>(end_clock-start_clock).count();
        step_time *= 1e-06;
        total_time += step_time;

        current_state_vec = next_state_vec;
    }
    std::cout << "End simulation" << std::endl;
    std::cout << "Total CPU time for control update: " << total_time << " [sec]" << std::endl;

    // Save simulation conditions.
    conditions_data << "simulation name: " << savefile_name << "\n";
    conditions_data << "simulation time: " << end_time-start_time << " [sec]\n";
    conditions_data << "CPU time for control update (total): " << total_time << " [sec]\n";
    conditions_data << "sampling time: " << sampling_period << " [sec]\n";
    conditions_data << "CPU time for control update (1step): " << total_time/((int)( (end_time-start_time)/(sampling_period))) << " [sec]\n";

    state_data.close();
    control_input_data.close();
    error_data.close();
    conditions_data.close();
}